

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void reportDefault(XML_Parser parser,ENCODING *enc,char *s,char *end)

{
  _func_int_ENCODING_ptr_char_ptr *local_40;
  ICHAR *dataPtr;
  char **eventEndPP;
  char **eventPP;
  char *end_local;
  char *s_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  eventPP = (char **)end;
  end_local = s;
  s_local = (char *)enc;
  enc_local = (ENCODING *)parser;
  if (enc->isUtf8 == '\0') {
    if (enc == *(ENCODING **)((long)parser + 0x118)) {
      eventEndPP = (char **)((long)parser + 0x218);
      dataPtr = (ICHAR *)((long)parser + 0x220);
    }
    else {
      eventEndPP = *(char ***)((long)parser + 0x230);
      dataPtr = (ICHAR *)(*(long *)((long)parser + 0x230) + 8);
    }
    do {
      local_40 = enc_local->charRefNumber;
      (**(code **)(s_local + 0x78))
                (s_local,&end_local,eventPP,&local_40,enc_local->predefinedEntityName);
      *(char **)dataPtr = end_local;
      (*enc_local[1].scanners[2])
                ((ENCODING *)enc_local->scanners[1],(char *)enc_local->charRefNumber,
                 (char *)((ulong)(local_40 + -(long)enc_local->charRefNumber) & 0xffffffff),
                 (char **)(local_40 + -(long)enc_local->charRefNumber));
      *eventEndPP = end_local;
    } while ((char **)end_local != eventPP);
  }
  else {
    (**(code **)((long)parser + 0xa0))
              (*(undefined8 *)((long)parser + 8),s,(long)end - (long)s & 0xffffffff);
  }
  return;
}

Assistant:

static void
reportDefault(XML_Parser parser, const ENCODING *enc, const char *s, const char *end)
{
  if (MUST_CONVERT(enc, s)) {
    const char **eventPP;
    const char **eventEndPP;
    if (enc == encoding) {
      eventPP = &eventPtr;
      eventEndPP = &eventEndPtr;
    }
    else {
      eventPP = &(openInternalEntities->internalEventPtr);
      eventEndPP = &(openInternalEntities->internalEventEndPtr);
    }
    do {
      ICHAR *dataPtr = (ICHAR *)dataBuf;
      XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)dataBufEnd);
      *eventEndPP = s;
      defaultHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
      *eventPP = s;
    } while (s != end);
  }
  else
    defaultHandler(handlerArg, (XML_Char *)s, (XML_Char *)end - (XML_Char *)s);
}